

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O2

double AndersonDarlingTest(int n,double *random_sample)

{
  ostream *poVar1;
  double dVar2;
  string local_48;
  double local_28;
  
  local_28 = AndersonDarlingStatistic(n,random_sample);
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  StringPrintf_abi_cxx11_(&local_48,"AD stat = %f, n=%d\n",local_28,n);
  std::operator<<(poVar1,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  dVar2 = AndersonDarlingPValue(n,local_28);
  return dVar2;
}

Assistant:

double AndersonDarlingTest(int n, double* random_sample) {
  double ad_statistic = AndersonDarlingStatistic(n, random_sample);
  LOG(INFO) << StringPrintf("AD stat = %f, n=%d\n", ad_statistic, n);
  double p = AndersonDarlingPValue(n, ad_statistic);
  return p;
}